

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

bool __thiscall
trun::Process_Unix::SpawnAndLoop
          (Process_Unix *this,string *command,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,ProcessCallbackBase *callback)

{
  _func_int *p_Var1;
  long lVar2;
  bool bVar3;
  int __errnum;
  int iVar4;
  ILogger *pIVar5;
  char *pcVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  char **__argv;
  ulong uStack_60;
  char *pcStack_58;
  string local_50;
  allocator<char> local_29;
  
  uVar7 = ((long)(((arguments->
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl._M_node._M_size << 0x20) + 0x200000000) >> 0x1d) + 0xfU &
          0xfffffffffffffff0;
  lVar2 = -uVar7;
  __argv = (char **)((long)&pcStack_58 + lVar2);
  pcVar6 = (command->_M_dataplus)._M_p;
  *(char **)((long)&pcStack_58 - uVar7) = pcVar6;
  *(undefined8 *)((long)&uStack_60 + lVar2) = 1;
  uVar7 = *(ulong *)((long)&uStack_60 + lVar2);
  p_Var8 = (_List_node_base *)arguments;
  while (p_Var8 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)arguments) {
    __argv[uVar7] = (char *)p_Var8[1]._M_next;
    uVar7 = uVar7 + 1;
  }
  __argv[uVar7 & 0xffffffff] = (char *)0x0;
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128584;
  __errnum = posix_spawnp(&this->pid,pcVar6,(posix_spawn_file_actions_t *)&this->child_fd_actions,
                          (posix_spawnattr_t *)0x0,__argv,_environ);
  if (__errnum == 0) {
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1285ea;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Process_Unix",&local_29)
    ;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1285f3;
    pIVar5 = gnilk::Logger::GetLogger(&local_50);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128602;
    gnilk::Log::Debug<char_const*>(pIVar5,"Spawn ok, entering monitoring loop");
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12860b;
    std::__cxx11::string::~string((string *)&local_50);
    p_Var1 = *(callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128613;
    (*p_Var1)(callback);
    while( true ) {
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12861b;
      bVar3 = IsFinished(this);
      if (bVar3) break;
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12862a;
      ConsumePipes(this,callback);
    }
    do {
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128637;
      iVar4 = ConsumePipes(this,callback);
    } while (0 < iVar4);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12864f;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Process_Unix",&local_29)
    ;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128658;
    pIVar5 = gnilk::Logger::GetLogger(&local_50);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128667;
    gnilk::Log::Debug<char_const*>(pIVar5,"Process loop finished");
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128670;
    std::__cxx11::string::~string((string *)&local_50);
    p_Var1 = (callback->super_ProcessCallbackInterface)._vptr_ProcessCallbackInterface[1];
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128679;
    (*p_Var1)();
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128682;
    ClosePipe((Process_Unix *)callback,this->pipe_stdout);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12868e;
    ClosePipe((Process_Unix *)callback,this->pipe_stderr);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x128696;
    posix_spawn_file_actions_destroy((posix_spawn_file_actions_t *)&this->child_fd_actions);
  }
  else {
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x12859f;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Process_Unix",&local_29)
    ;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1285a8;
    pIVar5 = gnilk::Logger::GetLogger(&local_50);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1285b3;
    pcVar6 = strerror(__errnum);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1285c8;
    gnilk::Log::Error<char_const*,int,char*>(pIVar5,"spawn: %d, %s",__errnum,pcVar6);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1285d1;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __errnum == 0;
}

Assistant:

bool Process_Unix::SpawnAndLoop(std::string command, std::list<std::string> &arguments, ProcessCallbackBase *callback) {

	// construct param array
	int count = arguments.size();
	char **param = (char **)alloca(sizeof(char *) * (count + 2));
	int i = 0;
	// command is argv[0]
	param[i] = (char *)command.c_str();
	i++;
	for (auto it = arguments.begin(); it!=arguments.end(); it++) {
		param[i] = (char *)it->c_str();
		i++;
	}
	param[i] = NULL;

	int status = posix_spawnp(&pid, command.c_str(), &child_fd_actions, NULL, param, environ);
	if (status == 0) {
        gnilk::Logger::GetLogger("Process_Unix")->Debug("Spawn ok, entering monitoring loop");
		callback->OnProcessStarted();
		while (!IsFinished()) {
			ConsumePipes(callback);
		}			
		// Consume what ever is left after the process exited, perhaps this is enough...
		while(ConsumePipes(callback)>0) {}


        gnilk::Logger::GetLogger("Process_Unix")->Debug("Process loop finished");
		callback->OnProcessExit();

		ClosePipe(pipe_stdout);
		ClosePipe(pipe_stderr);
	} else {
        gnilk::Logger::GetLogger("Process_Unix")->Error("spawn: %d, %s", status, strerror(status));
		return false;
	}
	posix_spawn_file_actions_destroy(&child_fd_actions);
	return true;
}